

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Date.cc
# Opt level: O0

YearMonthDay muduo::detail::getYearMonthDay(int julianDayNumber)

{
  int iVar1;
  YearMonthDay YVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int m;
  int e;
  int d;
  int c;
  int b;
  int a;
  int julianDayNumber_local;
  YearMonthDay ymd;
  
  iVar1 = ((julianDayNumber + 0x7d2c) * 4 + 3) / 0x23ab1;
  iVar4 = iVar1 * 0x23ab1;
  if (iVar4 < 0) {
    iVar4 = iVar4 + 3;
  }
  iVar3 = (julianDayNumber + 0x7d2c) - (iVar4 >> 2);
  iVar4 = (iVar3 * 4 + 3) / 0x5b5;
  iVar5 = iVar4 * 0x5b5;
  if (iVar5 < 0) {
    iVar5 = iVar5 + 3;
  }
  iVar3 = iVar3 - (iVar5 >> 2);
  iVar5 = (int)((ulong)((long)(iVar3 * 5 + 2) * -0x29d47f29) >> 0x20) + 2 + iVar3 * 5;
  iVar5 = (iVar5 >> 7) - (iVar5 >> 0x1f);
  YVar2.month = iVar5 + ((uint)((ulong)((long)iVar5 * 0x66666667) >> 0x22) - (iVar5 >> 0x1f)) * -0xc
                + 3;
  YVar2.year = iVar1 * 100 + iVar4 + -0x12c0 + iVar5 / 10;
  YVar2.day = (iVar3 + 1) - (iVar5 * 0x99 + 2) / 5;
  return YVar2;
}

Assistant:

struct Date::YearMonthDay getYearMonthDay(int julianDayNumber)
{
  int a = julianDayNumber + 32044;
  int b = (4 * a + 3) / 146097;
  int c = a - ((b * 146097) / 4);
  int d = (4 * c + 3) / 1461;
  int e = c - ((1461 * d) / 4);
  int m = (5 * e + 2) / 153;
  Date::YearMonthDay ymd;
  ymd.day = e - ((153 * m + 2) / 5) + 1;
  ymd.month = m + 3 - 12 * (m / 10);
  ymd.year = b * 100 + d - 4800 + (m / 10);
  return ymd;
}